

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O1

void Eigen::internal::
     generic_product_impl<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const,Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false>>
               (Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false> *dst,
               Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>
               *lhs,Matrix<float,__1,__1,_0,__1,__1> *rhs,Scalar *alpha)

{
  float *pfVar1;
  char *__function;
  float fVar2;
  Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_> destT;
  scalar_sum_op<float,_float> local_11d;
  Scalar local_11c;
  Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> local_118;
  long lStack_110;
  Index local_108;
  undefined1 local_f8 [40];
  variable_if_dynamic<long,__1> local_d0;
  XprTypeNested local_c8;
  variable_if_dynamic<long,__1> local_c0;
  variable_if_dynamic<long,__1> vStack_b8;
  Index local_b0;
  variable_if_dynamic<long,__1> local_a0;
  Index local_98;
  float *local_90;
  variable_if_dynamic<long,__1> local_88;
  Matrix<float,__1,__1,_0,__1,__1> *local_78;
  variable_if_dynamic<long,__1> local_70;
  variable_if_dynamic<long,__1> vStack_68;
  long local_60;
  undefined1 local_48 [16];
  variable_if_dynamic<long,__1> local_38;
  XprTypeNested XStack_30;
  variable_if_dynamic<long,__1> local_28;
  variable_if_dynamic<long,__1> vStack_20;
  variable_if_dynamic<long,__1> local_18;
  
  if ((rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 1)
  {
    local_18.m_value =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_outerStride;
    local_48._0_8_ =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
         .m_data;
    local_48._8_8_ =
         *(undefined8 *)
          &(lhs->
           super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
           .field_0x8;
    local_38.m_value =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
         .m_cols.m_value;
    XStack_30.m_matrix =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_xpr.m_matrix;
    local_28.m_value =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_startRow.m_value;
    vStack_20.m_value =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_startCol.m_value;
    local_c8.m_matrix =
         (non_const_type)
         (dst->super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>)
         .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
         m_outerStride;
    local_f8._0_8_ =
         (dst->super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>)
         .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
         m_data;
    local_f8._8_8_ =
         *(undefined8 *)
          &(dst->
           super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           field_0x8;
    local_f8._16_8_ =
         (dst->super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>)
         .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
         m_cols.m_value;
    local_f8._24_8_ =
         (dst->super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>)
         .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr;
    local_f8._32_8_ =
         (dst->super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>)
         .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
         m_startRow.m_value;
    local_d0.m_value =
         (dst->super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>)
         .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
         m_startCol.m_value;
    local_118.m_matrix = rhs;
    gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false>>>
              (&local_118,
               (Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
                *)local_48,
               (Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               local_f8,alpha);
    return;
  }
  local_f8._0_8_ =
       (lhs->
       super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
       .
       super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
       .m_data;
  local_f8._16_8_ =
       (lhs->
       super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
       .
       super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
       .m_cols.m_value;
  if ((long)local_f8._16_8_ < 0 && (PointerType)local_f8._0_8_ != (PointerType)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>, 1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>, 1, -1, true>, Level = 0]"
    ;
  }
  else {
    local_11c = *alpha;
    local_c8.m_matrix =
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_xpr.m_matrix;
    local_108 = (lhs->
                super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
                ).
                super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
                .m_outerStride;
    local_118.m_matrix =
         (non_const_type)
         (lhs->
         super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
         .m_startRow.m_value;
    lStack_110 = (lhs->
                 super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
                 .m_startCol.m_value;
    local_90 = (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
    local_88.m_value =
         (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    if (-1 < local_88.m_value || local_90 == (float *)0x0) {
      if (local_f8._16_8_ != local_88.m_value) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>, 1, -1, true>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>, 1, -1, true>, OtherDerived = Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                     );
      }
      local_98 = ((local_c8.m_matrix)->
                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      local_f8._24_8_ =
           (lhs->
           super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
           .m_data;
      local_f8._32_8_ =
           *(undefined8 *)
            &(lhs->
             super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
             .field_0x8;
      local_d0.m_value =
           (lhs->
           super_BlockImpl<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
           .m_cols.m_value;
      local_a0.m_value = 0;
      local_70.m_value = 0;
      vStack_68.m_value = 0;
      if (local_88.m_value == 0) {
        fVar2 = 0.0;
      }
      else {
        local_c0.m_value = (long)local_118.m_matrix;
        vStack_b8.m_value = lStack_110;
        local_b0 = local_108;
        local_78 = rhs;
        local_60 = local_88.m_value;
        if (local_88.m_value < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>, 1, -1, true>>, const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Block<const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, 1, -1, true>, 1, -1, true>>, const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                       );
        }
        XStack_30.m_matrix =
             (non_const_type)
             ((local_c8.m_matrix)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
             m_storage.m_rows;
        local_18.m_value =
             (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows
        ;
        local_48._8_8_ = local_f8._0_8_;
        local_28.m_value = (long)local_90;
        fVar2 = redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const>>,3,0>
                ::
                run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const>>
                          ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                            *)local_48,&local_11d,
                           (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                            *)local_f8);
      }
      pfVar1 = (dst->
               super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>)
               .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
               .m_data;
      *pfVar1 = local_11c * fVar2 + *pfVar1;
      return;
    }
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }